

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

void __thiscall Js::AsmJsModuleInfo::SetFunctionTableCount(AsmJsModuleInfo *this,int val)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  ModuleFunctionTable *pMVar5;
  size_t sVar6;
  Type *addr;
  size_t sVar7;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((this->mFunctionTables).ptr != (ModuleFunctionTable *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                ,0x675,"(mFunctionTables == nullptr)","mFunctionTables == nullptr");
    if (!bVar2) goto LAB_00957cd4;
    *puVar4 = 0;
  }
  this->mFunctionTableCount = val;
  local_58 = (undefined1  [8])&ModuleFunctionTable::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_46bf060;
  data.filename._0_4_ = 0x677;
  data.plusSize = (long)val;
  this_00 = Memory::Recycler::TrackAllocInfo(this->mRecycler,(TrackAllocData *)local_58);
  if (val == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pMVar5 = (ModuleFunctionTable *)&DAT_00000008;
  }
  else {
    sVar7 = (long)val << 4;
    sVar6 = 0xffffffffffffffff;
    if (-1 < val) {
      sVar6 = sVar7;
    }
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00957cd4;
      *puVar4 = 0;
    }
    pMVar5 = (ModuleFunctionTable *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (this_00,sVar6);
    if (pMVar5 == (ModuleFunctionTable *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00957cd4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    sVar6 = 0;
    do {
      *(undefined8 *)((long)&(pMVar5->moduleFunctionIndex).ptr + sVar6) = 0;
      sVar6 = sVar6 + 0x10;
    } while (sVar7 != sVar6);
  }
  addr = &this->mFunctionTables;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pMVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void AsmJsModuleInfo::SetFunctionTableCount(int val)
    {
        Assert(mFunctionTables == nullptr);
        mFunctionTableCount = val;
        mFunctionTables = RecyclerNewArray(mRecycler, ModuleFunctionTable, val);
    }